

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_string_format(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  SFormat k;
  TRef TVar3;
  uint uVar4;
  GCobj *pGVar5;
  int iVar6;
  IRRef1 IVar7;
  int iVar8;
  IRCallID IVar9;
  IRRef1 IVar10;
  FormatState fs;
  FormatState local_50;
  
  TVar1 = lj_ir_tostr(J,*J->base);
  pGVar5 = (GCobj *)argv2str(J,rd->argv);
  TVar2 = lj_ir_kgc(J,pGVar5,IRT_STR);
  (J->fold).ins.field_0.ot = 0x884;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
  lj_opt_fold(J);
  TVar1 = lj_ir_kptr_(J,IR_KPTR,J[-1].penalty + 0x38);
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x53050000;
  TVar2 = lj_opt_fold(J);
  local_50.p = (uint8_t *)&(pGVar5->gch).metatable;
  local_50.e = (uint8_t *)((long)pGVar5 + (ulong)(pGVar5->str).len + 0x10);
  iVar8 = 1;
  iVar6 = 0x65;
  TVar1 = TVar2;
  do {
    k = lj_strfmt_parse(&local_50);
    IVar7 = (IRRef1)TVar1;
    if (k == 2) {
      lj_ir_kint(J,2);
LAB_0013e408:
      pGVar5 = (GCobj *)lj_str_new(J->L,local_50.str,(ulong)local_50.len);
      TVar1 = lj_ir_kgc(J,pGVar5,IRT_STR);
      (J->fold).ins.field_0.ot = 0x5405;
      (J->fold).ins.field_0.op1 = IVar7;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
      TVar1 = lj_opt_fold(J);
      goto LAB_0013e5fc;
    }
    if (k == 0) {
      (J->fold).ins.field_0.ot = 0x5504;
      (J->fold).ins.field_0.op1 = IVar7;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
      TVar1 = lj_opt_fold(J);
      *J->base = TVar1;
      return;
    }
    uVar4 = J->base[iVar8];
    TVar3 = lj_ir_kint(J,k);
    if (5 < (k & 0xf) - 2) {
LAB_0013e641:
      recff_nyi(J,rd);
      return;
    }
    iVar8 = iVar8 + 1;
    IVar10 = (IRRef1)uVar4;
    switch(k & 0xf) {
    case 2:
      goto LAB_0013e408;
    case 3:
      IVar9 = IRCALL_lj_strfmt_putfnum_int;
      goto LAB_0013e4a5;
    case 4:
      IVar9 = IRCALL_lj_strfmt_putfnum_uint;
LAB_0013e4a5:
      if ((uVar4 >> 0x18 & 0x1f) - 0xf < 5) {
        if (k == 3) {
          (J->fold).ins.field_0.op1 = IVar10;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b040000;
          TVar1 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = 0x5405;
          (J->fold).ins.field_0.op1 = IVar7;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
          TVar1 = lj_opt_fold(J);
          break;
        }
        (J->fold).ins.field_0.op1 = IVar10;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x59160ad3;
        uVar4 = lj_opt_fold(J);
        IVar9 = IRCALL_lj_strfmt_putfxint;
      }
      else {
LAB_0013e4fe:
        uVar4 = lj_ir_tonum(J,uVar4);
      }
      TVar1 = lj_ir_call(J,IVar9,(ulong)TVar1,(ulong)TVar3,(ulong)uVar4);
      break;
    case 5:
      IVar9 = IRCALL_lj_strfmt_putfnum;
      goto LAB_0013e4fe;
    case 6:
      if ((uVar4 & 0x1f000000) != 0x4000000) goto LAB_0013e641;
      if (k == 6) {
        (J->fold).ins.field_0.ot = 0x5405;
        (J->fold).ins.field_0.op1 = IVar7;
        (J->fold).ins.field_0.op2 = IVar10;
        goto LAB_0013e576;
      }
      if ((k & 0x10) == 0) {
        IVar9 = IRCALL_lj_strfmt_putfstr;
        goto LAB_0013e5d3;
      }
      TVar1 = lj_ir_call(J,IRCALL_lj_strfmt_putquoted,(ulong)TVar1,(ulong)uVar4);
      break;
    case 7:
      uVar4 = lj_opt_narrow_toint(J,uVar4);
      if (k == 7) {
        (J->fold).ins.field_0.op1 = (IRRef1)uVar4;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b040002;
        TVar1 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x5405;
        (J->fold).ins.field_0.op1 = IVar7;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
LAB_0013e576:
        TVar1 = lj_opt_fold(J);
      }
      else {
        IVar9 = IRCALL_lj_strfmt_putfchar;
LAB_0013e5d3:
        TVar1 = lj_ir_call(J,IVar9,(ulong)TVar1,(ulong)TVar3,(ulong)uVar4);
      }
    }
LAB_0013e5fc:
    iVar6 = iVar6 + -1;
    if (iVar6 == 0) {
      lj_trace_err(J,LJ_TRERR_TRACEOV);
    }
  } while( true );
}

Assistant:

static void LJ_FASTCALL recff_string_format(jit_State *J, RecordFFData *rd)
{
  TRef trfmt = lj_ir_tostr(J, J->base[0]);
  GCstr *fmt = argv2str(J, &rd->argv[0]);
  int arg = 1;
  TRef hdr, tr;
  FormatState fs;
  SFormat sf;
  int nfmt = 0;
  /* Specialize to the format string. */
  emitir(IRTG(IR_EQ, IRT_STR), trfmt, lj_ir_kstr(J, fmt));
  tr = hdr = recff_bufhdr(J);
  lj_strfmt_init(&fs, strdata(fmt), fmt->len);
  while ((sf = lj_strfmt_parse(&fs)) != STRFMT_EOF) {  /* Parse format. */
    TRef tra = sf == STRFMT_LIT ? 0 : J->base[arg++];
    TRef trsf = lj_ir_kint(J, (int32_t)sf);
    IRCallID id;
    switch (STRFMT_TYPE(sf)) {
    case STRFMT_LIT:
      tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr,
		  lj_ir_kstr(J, lj_str_new(J->L, fs.str, fs.len)));
      break;
    case STRFMT_INT:
      id = IRCALL_lj_strfmt_putfnum_int;
    handle_int:
      if (!tref_isinteger(tra))
	goto handle_num;
      if (sf == STRFMT_INT) { /* Shortcut for plain %d. */
	tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr,
		    emitir(IRT(IR_TOSTR, IRT_STR), tra, IRTOSTR_INT));
      } else {
#if LJ_HASFFI
	tra = emitir(IRT(IR_CONV, IRT_U64), tra,
		     (IRT_INT|(IRT_U64<<5)|IRCONV_SEXT));
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfxint, tr, trsf, tra);
	lj_needsplit(J);
#else
	recff_nyiu(J, rd);  /* Don't bother working around this NYI. */
	return;
#endif
      }
      break;
    case STRFMT_UINT:
      id = IRCALL_lj_strfmt_putfnum_uint;
      goto handle_int;
    case STRFMT_NUM:
      id = IRCALL_lj_strfmt_putfnum;
    handle_num:
      tra = lj_ir_tonum(J, tra);
      tr = lj_ir_call(J, id, tr, trsf, tra);
      if (LJ_SOFTFP32) lj_needsplit(J);
      break;
    case STRFMT_STR:
      if (!tref_isstr(tra)) {
	recff_nyiu(J, rd);  /* NYI: __tostring and non-string types for %s. */
	return;
      }
      if (sf == STRFMT_STR)  /* Shortcut for plain %s. */
	tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr, tra);
      else if ((sf & STRFMT_T_QUOTED))
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putquoted, tr, tra);
      else
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfstr, tr, trsf, tra);
      break;
    case STRFMT_CHAR:
      tra = lj_opt_narrow_toint(J, tra);
      if (sf == STRFMT_CHAR)  /* Shortcut for plain %c. */
	tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr,
		    emitir(IRT(IR_TOSTR, IRT_STR), tra, IRTOSTR_CHAR));
      else
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfchar, tr, trsf, tra);
      break;
    case STRFMT_PTR:  /* NYI */
    case STRFMT_ERR:
    default:
      recff_nyiu(J, rd);
      return;
    }
    if (++nfmt > 100) lj_trace_err(J, LJ_TRERR_TRACEOV);
  }
  J->base[0] = emitir(IRT(IR_BUFSTR, IRT_STR), tr, hdr);
}